

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzhyperplane.cpp
# Opt level: O0

REAL __thiscall
TPZHyperPlaneIntersect::EdgeIntersect
          (TPZHyperPlaneIntersect *this,TPZGeoElSide *gelside,TPZHyperPlane *plane)

{
  TPZVec<double> *point;
  double *pdVar1;
  undefined1 *in_RDX;
  undefined1 *puVar2;
  TPZVec<double> *loc;
  TPZVec<double> *extraout_XMM0_Qa;
  int i;
  REAL inner;
  REAL detjac;
  TPZFNMatrix<3,_double> axes;
  TPZFNMatrix<1,_double> jacinv;
  TPZFNMatrix<1,_double> edgejac;
  int niter;
  REAL distance;
  TPZManVector<double,_3> X;
  TPZManVector<double,_3> planejac;
  TPZManVector<double,_1> edgeparam;
  TPZFMatrix<double> *in_stack_000008c8;
  REAL *in_stack_000008d0;
  TPZFMatrix<double> *in_stack_000008d8;
  TPZFMatrix<double> *in_stack_000008e0;
  TPZVec<double> *in_stack_000008e8;
  TPZGeoElSide *in_stack_000008f0;
  TPZManVector<double,_3> *this_00;
  TPZVec<double> *in_stack_fffffffffffffcd0;
  double in_stack_fffffffffffffcd8;
  TPZFNMatrix<3,_double> *in_stack_fffffffffffffce0;
  TPZVec<double> *in_stack_fffffffffffffce8;
  TPZManVector<double,_1> *in_stack_fffffffffffffcf0;
  TPZVec<double> *in_stack_fffffffffffffd10;
  TPZVec<double> *result;
  TPZVec<double> *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  int iVar3;
  double local_2d8;
  undefined1 local_178 [164];
  int local_d4;
  TPZVec<double> *local_d0;
  TPZVec<double> local_80;
  undefined8 local_48;
  TPZVec<double> local_40;
  undefined1 *local_18;
  
  local_48 = 0;
  local_18 = in_RDX;
  TPZManVector<double,_1>::TPZManVector
            (in_stack_fffffffffffffcf0,(int64_t)in_stack_fffffffffffffce8,
             (double *)in_stack_fffffffffffffce0);
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8
            );
  TPZGeoElSide::X((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                  in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  loc = (TPZVec<double> *)
        TPZHyperPlane::Distance
                  ((TPZHyperPlane *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                   (TPZVec<double> *)in_stack_fffffffffffffce0);
  local_d4 = 0;
  puVar2 = local_18;
  local_d0 = loc;
  while (std::abs((int)puVar2), 1e-06 < (double)extraout_XMM0_Qa && local_d4 < 5) {
    result = extraout_XMM0_Qa;
    TPZFNMatrix<1,_double>::TPZFNMatrix
              ((TPZFNMatrix<1,_double> *)in_stack_fffffffffffffce0,
               (int64_t)in_stack_fffffffffffffcd8,(int64_t)in_stack_fffffffffffffcd0);
    TPZFNMatrix<1,_double>::TPZFNMatrix
              ((TPZFNMatrix<1,_double> *)in_stack_fffffffffffffce0,
               (int64_t)in_stack_fffffffffffffcd8,(int64_t)in_stack_fffffffffffffcd0);
    TPZFNMatrix<3,_double>::TPZFNMatrix
              (in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    TPZGeoElSide::Jacobian
              (in_stack_000008f0,in_stack_000008e8,in_stack_000008e0,in_stack_000008d8,
               in_stack_000008d0,in_stack_000008c8);
    local_2d8 = 0.0;
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      pdVar1 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffce0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffcd8,(int64_t)in_stack_fffffffffffffcd0);
      in_stack_fffffffffffffcf0 = (TPZManVector<double,_1> *)*pdVar1;
      pdVar1 = TPZVec<double>::operator[](&local_80,(long)iVar3);
      local_2d8 = (double)in_stack_fffffffffffffcf0 * *pdVar1 + local_2d8;
    }
    point = (TPZVec<double> *)
            TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffffce0->super_TPZFMatrix<double>,
                       (int64_t)in_stack_fffffffffffffcd8,(int64_t)in_stack_fffffffffffffcd0);
    in_stack_fffffffffffffcd8 = ((double)point->_vptr_TPZVec * (double)local_d0) / local_2d8;
    in_stack_fffffffffffffce0 = (TPZFNMatrix<3,_double> *)TPZVec<double>::operator[](&local_40,0);
    (in_stack_fffffffffffffce0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)
         ((double)(in_stack_fffffffffffffce0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable - in_stack_fffffffffffffcd8)
    ;
    TPZGeoElSide::X((TPZGeoElSide *)CONCAT44(iVar3,in_stack_fffffffffffffd20),loc,result);
    in_stack_fffffffffffffcd0 =
         (TPZVec<double> *)
         TPZHyperPlane::Distance
                   ((TPZHyperPlane *)in_stack_fffffffffffffcf0,point,
                    (TPZVec<double> *)in_stack_fffffffffffffce0);
    local_d4 = local_d4 + 1;
    local_d0 = in_stack_fffffffffffffcd0;
    TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x1f44ef7);
    TPZFNMatrix<1,_double>::~TPZFNMatrix((TPZFNMatrix<1,_double> *)0x1f44f04);
    puVar2 = local_178;
    TPZFNMatrix<1,_double>::~TPZFNMatrix((TPZFNMatrix<1,_double> *)0x1f44f11);
  }
  if (local_d4 == 5) {
    pzinternal::DebugStopImpl
              ((char *)axes.super_TPZFMatrix<double>.fPivot.fExtAlloc._8_8_,
               axes.super_TPZFMatrix<double>.fPivot.fExtAlloc._0_8_);
  }
  pdVar1 = TPZVec<double>::operator[](&local_40,0);
  this_00 = (TPZManVector<double,_3> *)*pdVar1;
  TPZManVector<double,_3>::~TPZManVector(this_00);
  TPZManVector<double,_3>::~TPZManVector(this_00);
  TPZManVector<double,_1>::~TPZManVector((TPZManVector<double,_1> *)this_00);
  return (REAL)this_00;
}

Assistant:

REAL TPZHyperPlaneIntersect::EdgeIntersect(const TPZGeoElSide &gelside, const TPZHyperPlane &plane)
{
    TPZManVector<REAL, 1> edgeparam(1,0.);
    TPZManVector<REAL,3> planejac(3), X(3);
    gelside.X(edgeparam, X);
    REAL distance = plane.Distance(X,planejac);
    int niter = 0;
    while (std::abs(distance) > 1.e-6 && niter < 5) {
        TPZFNMatrix<1,REAL> edgejac(1,1), jacinv(1,1);
        TPZFNMatrix<3,REAL> axes(1,3);
        REAL detjac;
        gelside.Jacobian(edgeparam,edgejac, axes, detjac, jacinv);
        REAL inner = 0;
        for (int i=0; i<3; i++) {
            inner += axes(0,i)*planejac[i];
        }
        edgeparam[0] -= jacinv(0,0)*distance/inner;
        gelside.X(edgeparam, X);
        distance = plane.Distance(X, planejac);
        niter++;
    }
    if (niter == 5) {
        DebugStop();
    }
    return edgeparam[0];
}